

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

void __thiscall
Random_keys::mutacaoAdaptavitva(Random_keys *this,RK_Individual *ind,float pctTam,float pctChance)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  
  iVar2 = ind->number_of_edges;
  fVar5 = roundf(pctChance * 100.0);
  iVar1 = rand();
  if (iVar1 % 100 <= (int)fVar5) {
    fVar5 = roundf((float)iVar2 * pctTam);
    uVar4 = 0;
    uVar3 = (ulong)(uint)(int)fVar5;
    if ((int)fVar5 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      rand();
      iVar2 = rand();
      ind->weights[uVar4] = (double)(iVar2 % 100);
    }
  }
  return;
}

Assistant:

void Random_keys::mutacaoAdaptavitva(RK_Individual *ind, float pctTam, float pctChance) {

    int tam = round(pctTam* ind->getNumEdges());
    int n = round(pctChance*100);
    int m = rand() % 100;

    if(m<=n){
        for(int i=0; i<tam; i++){
            int j = rand() % ind->getNumEdges();

            ind->getWeights()[i] = rand() % RANGEPESO;
        }
    }
}